

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::ArraysOfArrays::Run(ArraysOfArrays *this)

{
  CallLogWrapper *this_00;
  GLenum *pGVar1;
  pointer pcVar2;
  uint uVar3;
  long lVar4;
  undefined8 src_vs;
  GLuint program;
  mapped_type *pmVar5;
  long error;
  GLenum props [13];
  undefined1 local_b8 [36];
  undefined8 uStack_94;
  undefined4 local_8c;
  GLint local_88;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(props,this);
  src_vs = props._0_8_;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(local_b8,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,(char *)local_b8._0_8_,false);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
  }
  pGVar1 = props + 4;
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e1,0x92f6,0xb);
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indices._M_t._M_impl.super__Rb_tree_header._M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  props._0_8_ = pGVar1;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"a[2][1]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indices,props,&error);
  pcVar2 = local_b8 + 0x10;
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"a[2][1][0]","");
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a[2][1]","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_b8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe]
  )(this,(ulong)program,0x92e1,props,(ulong)*pmVar5,&error);
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"a[2][1]","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar5;
  local_b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a[2][1][0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,local_b8,&error);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props[8] = 0x9301;
  props[9] = 0x930b;
  props[10] = 0x930a;
  props[0xb] = 0x9306;
  props[4] = 0x92fd;
  props[5] = 0x92fe;
  props[6] = 0x92ff;
  props[7] = 0x9300;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x92fc;
  props[0xc] = 0x930e;
  local_b8._0_8_ = (pointer)0x8b520000000b;
  local_b8._8_4_ = 5;
  local_b8._12_4_ = 0xffffffff;
  local_b8._16_4_ = 0xffffffff;
  local_b8._20_4_ = 0xffffffff;
  local_b8._24_4_ = 0xffffffff;
  local_b8._28_8_ = 0xffffffff00000000;
  uStack_94 = 0;
  local_8c = 1;
  local_88 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"a[2][1]");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"a[2][1]","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_80);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e1,(ulong)*pmVar5,0xd,props,0xd,local_b8,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  lVar4 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indices._M_t);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_MAX_NAME_LENGTH, 11, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "a[2][1]", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, "a[2][1][0]", indices["a[2][1]"], error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["a[2][1]"], "a[2][1][0]", error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = { 11, 35666, 5, -1, -1, -1, -1, 0, -1, 0, 0, 1, glGetUniformLocation(program, "a[2][1]") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["a[2][1]"], 13, props, 13, expected, error);

		glDeleteProgram(program);
		return error;
	}